

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  Option *this_00;
  App *pAVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  string *psVar8;
  long lVar9;
  size_t sVar10;
  pointer ppAVar11;
  pointer pbVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  App *pAVar15;
  pointer ppAVar16;
  string value;
  string single_name;
  string name;
  string keyChars;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string commentLead;
  string local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string commentTest;
  _Any_data local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  string local_298 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string local_218;
  string local_1f8 [32];
  stringstream out;
  ostream local_1c8 [376];
  string local_50;
  
  uVar13 = (uint)write_description;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  commentLead._M_dataplus._M_p = (pointer)&commentLead.field_2;
  commentLead._M_string_length = 0;
  commentLead.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::push_back((char)&commentLead);
  ::std::__cxx11::string::push_back((char)&commentLead);
  ::std::__cxx11::string::string((string *)&commentTest,"#;",(allocator *)&keyChars);
  ::std::__cxx11::string::push_back((char)&commentTest);
  ::std::__cxx11::string::push_back((char)&commentTest);
  ::std::__cxx11::string::string((string *)&keyChars,(string *)&commentTest);
  ::std::__cxx11::string::push_back((char)&keyChars);
  ::std::__cxx11::string::push_back((char)&keyChars);
  ::std::__cxx11::string::push_back((char)&keyChars);
  ::std::__cxx11::string::push_back((char)&keyChars);
  ::std::__cxx11::string::push_back((char)&keyChars);
  ::std::__cxx11::string::push_back((char)&keyChars);
  App::get_groups_abi_cxx11_(&groups,app);
  pbVar12 = groups.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&single_name,"OPTIONS",(allocator *)&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&groups,(const_iterator)pbVar12,&single_name);
  ::std::__cxx11::string::~string((string *)&single_name);
  bVar6 = false;
  for (pbVar12 = groups.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar12 !=
      groups.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar12 = pbVar12 + 1) {
    bVar5 = ::std::operator==(pbVar12,"OPTIONS");
    if (bVar5) {
      bVar5 = true;
      bVar4 = true;
      if (!bVar6) {
LAB_0012407b:
        if (((write_description) && (bVar6 = ::std::operator!=(pbVar12,"OPTIONS"), bVar6)) &&
           (pbVar12->_M_string_length != 0)) {
          poVar7 = ::std::operator<<(local_1c8,'\n');
          poVar7 = ::std::operator<<(poVar7,this->commentChar);
          poVar7 = ::std::operator<<(poVar7,(string *)&commentLead);
          poVar7 = ::std::operator<<(poVar7,(string *)pbVar12);
          ::std::operator<<(poVar7," Options\n");
        }
        local_2b8._M_unused._M_object = (void *)0x0;
        local_2b8._8_8_ = 0;
        local_2a8 = 0;
        uStack_2a0 = 0;
        App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         &local_360,app,(function<bool_(const_CLI::Option_*)> *)&local_2b8);
        std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
        sVar2 = local_360._M_string_length;
        for (_Var14._M_p = local_360._M_dataplus._M_p; _Var14._M_p != (pointer)sVar2;
            _Var14._M_p = _Var14._M_p + 8) {
          this_00 = *(Option **)_Var14._M_p;
          if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
             ((bVar6 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)this_00,pbVar12), !bVar6 ||
              ((bVar6 = ::std::operator==(pbVar12,"OPTIONS"), bVar6 &&
               ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
            psVar8 = Option::get_single_name_abi_cxx11_(this_00);
            ::std::__cxx11::string::string((string *)&single_name,(string *)psVar8);
            if (single_name._M_string_length == 0) {
              ::std::__cxx11::string::~string((string *)&single_name);
            }
            else {
              Option::reduced_results_abi_cxx11_((results_t *)&subcommands,this_00);
              detail::ini_join(&value,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&subcommands,this->arraySeparator,this->arrayStart,
                               this->arrayEnd,this->stringQuote,this->literalQuote);
              bVar6 = value._M_string_length == 0 && default_also;
              if (bVar6) {
                ::std::__cxx11::string::string((string *)&name,(string *)&this_00->default_str_);
                sVar3 = name._M_string_length;
                ::std::__cxx11::string::~string((string *)&name);
                if (sVar3 == 0) {
                  ::std::__cxx11::string::assign((char *)&value);
                }
                else {
                  ::std::__cxx11::string::string
                            ((string *)&local_320,(string *)&this_00->default_str_);
                  detail::convert_arg_for_ini
                            (&name,&local_320,this->stringQuote,this->literalQuote,false);
                  ::std::__cxx11::string::operator=((string *)&value,(string *)&name);
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_320);
                }
              }
              if (value._M_string_length != 0) {
                if ((this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (this_00->fnames_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ::std::__cxx11::string::string((string *)&local_50,(string *)&value);
                  Option::get_flag_value(&name,this_00,&single_name,&local_50);
                  ::std::__cxx11::string::operator=((string *)&value,(string *)&name);
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_50);
                }
                if ((write_description) && ((this_00->description_)._M_string_length != 0)) {
                  lVar9 = ::std::ostream::tellp();
                  if (lVar9 != 0) {
                    ::std::operator<<(local_1c8,'\n');
                  }
                  poVar7 = ::std::operator<<(local_1c8,(string *)&commentLead);
                  ::std::__cxx11::string::string
                            ((string *)&local_218,(string *)&this_00->description_);
                  detail::fix_newlines(&name,&commentLead,&local_218);
                  poVar7 = ::std::operator<<(poVar7,(string *)&name);
                  ::std::operator<<(poVar7,'\n');
                  ::std::__cxx11::string::~string((string *)&name);
                  ::std::__cxx11::string::~string((string *)&local_218);
                }
                clean_name_string(&single_name,&keyChars);
                ::std::operator+(&name,prefix,&single_name);
                if ((bVar6 & this->commentDefaultsBool) == 1) {
                  ::std::operator+(&local_320,this->commentChar,&name);
                  ::std::__cxx11::string::operator=((string *)&name,(string *)&local_320);
                  ::std::__cxx11::string::~string((string *)&local_320);
                }
                poVar7 = ::std::operator<<(local_1c8,(string *)&name);
                poVar7 = ::std::operator<<(poVar7,this->valueDelimiter);
                poVar7 = ::std::operator<<(poVar7,(string *)&value);
                ::std::operator<<(poVar7,'\n');
                ::std::__cxx11::string::~string((string *)&name);
              }
              ::std::__cxx11::string::~string((string *)&value);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&subcommands);
              ::std::__cxx11::string::~string((string *)&single_name);
            }
          }
        }
        std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                  ((_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                   &local_360);
        bVar4 = bVar5;
      }
    }
    else {
      bVar5 = pbVar12->_M_string_length == 0;
      bVar4 = true;
      if (!(bool)(bVar5 & bVar6)) {
        bVar5 = (bool)(bVar5 | bVar6);
        goto LAB_0012407b;
      }
    }
    bVar6 = bVar4;
  }
  single_name.field_2._M_allocated_capacity = 0;
  single_name.field_2._8_8_ = 0;
  single_name._M_dataplus._M_p = (pointer)0x0;
  single_name._M_string_length = 0;
  App::get_subcommands(&subcommands,app,(function<bool_(const_CLI::App_*)> *)&single_name);
  std::_Function_base::~_Function_base((_Function_base *)&single_name);
  ppAVar11 = subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar16 = subcommands.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppAVar16 != ppAVar11; ppAVar16 = ppAVar16 + 1) {
    pAVar1 = *ppAVar16;
    if (((pAVar1->name_)._M_string_length == 0) &&
       ((default_also || (sVar10 = App::count_all(pAVar1), sVar10 != 0)))) {
      if ((write_description) && ((pAVar1->group_)._M_string_length != 0)) {
        poVar7 = ::std::operator<<(local_1c8,'\n');
        poVar7 = ::std::operator<<(poVar7,(string *)&commentLead);
        poVar7 = ::std::operator<<(poVar7,(string *)&pAVar1->group_);
        ::std::operator<<(poVar7," Options\n");
      }
      ::std::__cxx11::string::string(local_1f8,(string *)prefix);
      (**(this->super_Config)._vptr_Config)
                (&single_name,this,pAVar1,default_also,(ulong)uVar13,local_1f8);
      ::std::operator<<(local_1c8,(string *)&single_name);
      ::std::__cxx11::string::~string((string *)&single_name);
      ::std::__cxx11::string::~string(local_1f8);
    }
  }
  for (ppAVar11 = subcommands.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppAVar11 !=
      subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar11 = ppAVar11 + 1) {
    pAVar1 = *ppAVar11;
    if (((pAVar1->name_)._M_string_length != 0) &&
       ((default_also || (sVar10 = App::count_all(pAVar1), sVar10 != 0)))) {
      ::std::__cxx11::string::string((string *)&single_name,(string *)&pAVar1->name_);
      clean_name_string(&single_name,&keyChars);
      if ((pAVar1->configurable_ == true) &&
         ((default_also || (bVar6 = App::got_subcommand(app,pAVar1), bVar6)))) {
        if ((prefix->_M_string_length == 0) && (app->parent_ != (App *)0x0)) {
          ::std::__cxx11::string::string((string *)&value,(string *)&app->name_);
          clean_name_string(&value,&keyChars);
          ::std::operator+(&local_320,&value,this->parentSeparatorChar);
          ::std::operator+(&name,&local_320,&single_name);
          ::std::__cxx11::string::operator=((string *)&single_name,(string *)&name);
          ::std::__cxx11::string::~string((string *)&name);
          ::std::__cxx11::string::~string((string *)&local_320);
          pAVar15 = app->parent_;
          while (pAVar15->parent_ != (App *)0x0) {
            ::std::__cxx11::string::string((string *)&name,(string *)&pAVar15->name_);
            clean_name_string(&name,&keyChars);
            ::std::operator+(&local_360,&name,this->parentSeparatorChar);
            ::std::operator+(&local_320,&local_360,&single_name);
            ::std::__cxx11::string::operator=((string *)&single_name,(string *)&local_320);
            ::std::__cxx11::string::~string((string *)&local_320);
            ::std::__cxx11::string::~string((string *)&local_360);
            pAVar15 = pAVar15->parent_;
            ::std::__cxx11::string::~string((string *)&name);
          }
          poVar7 = ::std::operator<<(local_1c8,'[');
          poVar7 = ::std::operator<<(poVar7,(string *)&single_name);
          ::std::operator<<(poVar7,"]\n");
          ::std::__cxx11::string::~string((string *)&value);
        }
        else {
          poVar7 = ::std::operator<<(local_1c8,'[');
          poVar7 = ::std::operator<<(poVar7,(string *)prefix);
          poVar7 = ::std::operator<<(poVar7,(string *)&single_name);
          ::std::operator<<(poVar7,"]\n");
        }
        ::std::__cxx11::string::string((string *)&local_238,"",(allocator *)&name);
        (**(this->super_Config)._vptr_Config)
                  (&value,this,pAVar1,default_also,(ulong)uVar13,&local_238);
        ::std::operator<<(local_1c8,(string *)&value);
        ::std::__cxx11::string::~string((string *)&value);
        psVar8 = &local_238;
      }
      else {
        ::std::operator+(&name,prefix,&single_name);
        ::std::operator+(&local_258,&name,this->parentSeparatorChar);
        (**(this->super_Config)._vptr_Config)
                  (&value,this,pAVar1,default_also,(ulong)uVar13,&local_258);
        ::std::operator<<(local_1c8,(string *)&value);
        ::std::__cxx11::string::~string((string *)&value);
        ::std::__cxx11::string::~string((string *)&local_258);
        psVar8 = &name;
      }
      ::std::__cxx11::string::~string((string *)psVar8);
      ::std::__cxx11::string::~string((string *)&single_name);
    }
  }
  if (write_description) {
    ::std::__cxx11::stringbuf::str();
    sVar2 = single_name._M_string_length;
    ::std::__cxx11::string::~string((string *)&single_name);
    if (sVar2 != 0) {
      ::std::operator+(&name,this->commentChar,&commentLead);
      ::std::operator+(&local_360,this->commentChar,&commentLead);
      ::std::__cxx11::string::string((string *)local_298,(string *)&app->description_);
      detail::fix_newlines(&local_320,&local_360,local_298);
      ::std::operator+(&value,&name,&local_320);
      ::std::operator+(&single_name,&value,'\n');
      ::std::__cxx11::string::~string((string *)&value);
      ::std::__cxx11::string::~string((string *)&local_320);
      ::std::__cxx11::string::~string((string *)local_298);
      ::std::__cxx11::string::~string((string *)&local_360);
      ::std::__cxx11::string::~string((string *)&name);
      ::std::__cxx11::stringbuf::str();
      ::std::operator+(__return_storage_ptr__,&single_name,&value);
      ::std::__cxx11::string::~string((string *)&value);
      ::std::__cxx11::string::~string((string *)&single_name);
      goto LAB_00124c71;
    }
  }
  ::std::__cxx11::stringbuf::str();
LAB_00124c71:
  std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
            (&subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&groups);
  ::std::__cxx11::string::~string((string *)&keyChars);
  ::std::__cxx11::string::~string((string *)&commentTest);
  ::std::__cxx11::string::~string((string *)&commentLead);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("OPTIONS"));

    for(auto &group : groups) {
        if(group == "OPTIONS" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "OPTIONS" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "OPTIONS" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}